

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

void __thiscall
glcts::ViewportArray::DrawTestBase::setup2x2Viewport(DrawTestBase *this,PROVOKING_VERTEX provoking)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TestError *this_00;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  bool bVar10;
  GLfloat data [16];
  float local_58 [16];
  long lVar6;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  iVar4 = 0;
  iVar2 = 0;
  do {
    iVar1 = iVar4 * 4;
    iVar9 = 0;
    iVar7 = 0;
    do {
      local_58[iVar1 + iVar9] = (float)iVar7 * 64.0;
      local_58[iVar1 + 1 + iVar9] = (float)iVar2 * 64.0;
      local_58[iVar1 + 2 + iVar9] = 64.0;
      local_58[iVar1 + iVar9 + 3] = 64.0;
      iVar7 = iVar7 + 1;
      iVar9 = iVar9 + 4;
    } while (iVar9 == 4);
    iVar4 = iVar4 + iVar7;
    bVar10 = iVar2 == 0;
    iVar2 = iVar2 + 1;
  } while (bVar10);
  (**(code **)(lVar6 + 0x1a08))(0,4,local_58);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"ViewportArrayv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0xccd);
  if ((uVar3 & 0x300) == 0x100) {
    uVar8 = 0x8e4d;
    if (provoking != FIRST) {
      if (provoking != LAST) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                   ,0xcdb);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar8 = 0x8e4e;
    }
    (**(code **)(lVar6 + 0x11f0))(uVar8);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"ProvokingVertex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xcdf);
  }
  return;
}

Assistant:

void DrawTestBase::setup2x2Viewport(PROVOKING_VERTEX provoking)
{
	const glw::Functions&   gl			 = m_context.getRenderContext().getFunctions();
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	GLint   index = 0;
	GLfloat data[4 * 4 /* 4x4 * (x + y + w + h) */];

	GLfloat width  = (GLfloat)(m_width / 2);
	GLfloat height = (GLfloat)(m_height / 2);

	for (GLuint y = 0; y < 2; ++y)
	{
		for (GLuint x = 0; x < 2; ++x)
		{
			data[index * 4 + 0] = (GLfloat)((GLfloat)x * width);
			data[index * 4 + 1] = (GLfloat)((GLfloat)y * height);
			data[index * 4 + 2] = width;
			data[index * 4 + 3] = height;

			index += 1;
		}
	}

	gl.viewportArrayv(0 /* first */, 4 /*count */, data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportArrayv");

	if (glu::isContextTypeGLCore(context_type))
	{
		GLenum mode = 0;
		switch (provoking)
		{
		case FIRST:
			mode = GL_FIRST_VERTEX_CONVENTION;
			break;
		case LAST:
			mode = GL_LAST_VERTEX_CONVENTION;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		gl.provokingVertex(mode);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ProvokingVertex");
	}
	else
	{
		/* can't control the provoking vertex in ES yet - it stays as LAST */
		DE_ASSERT(glu::isContextTypeES(context_type));
		DE_UNREF(provoking);
	}
}